

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O1

bool __thiscall
cmCTest::HandleTestModelArgument
          (cmCTest *this,char *ctestExec,size_t *i,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pcVar1;
  pointer pbVar2;
  _Head_base<0UL,_cmCTest::Private_*,_false> _Var3;
  char *__s;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  size_t sVar7;
  ostream *poVar8;
  size_t sVar9;
  bool bVar10;
  char *in_R8;
  string *s;
  string_view varg1;
  ostringstream cmCTestLog_msg;
  long *local_1d0;
  long local_1c0 [2];
  char *local_1b0;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  varg1._M_str = "--test-model";
  varg1._M_len = (size_t)"-M";
  bVar5 = CheckArgument((cmCTest *)
                        ((args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + *i),(string *)&DAT_00000002,
                        varg1,in_R8);
  bVar10 = true;
  if (bVar5) {
    pbVar2 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (*i < ((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) - 1U) {
      sVar7 = *i + 1;
      *i = sVar7;
      s = pbVar2 + sVar7;
      cmsys::SystemTools::LowerCase((string *)local_1a8,s);
      uVar4 = local_1a8._0_8_;
      local_1b0 = ctestExec;
      if (local_1a8._8_8_ == 7) {
        iVar6 = bcmp((void *)local_1a8._0_8_,"nightly",7);
        bVar5 = iVar6 == 0;
      }
      else {
        bVar5 = false;
      }
      pcVar1 = local_1a8 + 0x10;
      if ((pointer)uVar4 != pcVar1) {
        operator_delete((void *)uVar4,local_1a8._16_8_ + 1);
      }
      if (bVar5) {
        _Var3._M_head_impl =
             (this->Impl)._M_t.
             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
             super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
        (_Var3._M_head_impl)->InteractiveDebugMode = false;
        (_Var3._M_head_impl)->TestModel = 1;
      }
      else {
        cmsys::SystemTools::LowerCase((string *)local_1a8,s);
        uVar4 = local_1a8._0_8_;
        if (local_1a8._8_8_ == 10) {
          iVar6 = bcmp((void *)local_1a8._0_8_,"continuous",10);
          bVar5 = iVar6 == 0;
        }
        else {
          bVar5 = false;
        }
        if ((pointer)uVar4 != pcVar1) {
          operator_delete((void *)uVar4,local_1a8._16_8_ + 1);
        }
        if (bVar5) {
          _Var3._M_head_impl =
               (this->Impl)._M_t.
               super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
               super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
               super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
          (_Var3._M_head_impl)->InteractiveDebugMode = false;
          (_Var3._M_head_impl)->TestModel = 2;
        }
        else {
          cmsys::SystemTools::LowerCase((string *)local_1a8,s);
          uVar4 = local_1a8._0_8_;
          if (local_1a8._8_8_ == 0xc) {
            iVar6 = bcmp((void *)local_1a8._0_8_,"experimental",0xc);
            bVar5 = iVar6 == 0;
          }
          else {
            bVar5 = false;
          }
          if ((pointer)uVar4 != pcVar1) {
            operator_delete((void *)uVar4,local_1a8._16_8_ + 1);
          }
          __s = local_1b0;
          if (bVar5) {
            _Var3._M_head_impl =
                 (this->Impl)._M_t.
                 super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
                 super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
            (_Var3._M_head_impl)->InteractiveDebugMode = false;
            (_Var3._M_head_impl)->TestModel = 0;
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"CTest -M called with incorrect option: ",0x27);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,(s->_M_dataplus)._M_p,s->_M_string_length);
            std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
            std::__cxx11::stringbuf::str();
            Log(this,7,
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
                ,0xb25,(char *)local_1d0,false);
            if (local_1d0 != local_1c0) {
              operator_delete(local_1d0,local_1c0[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base(local_138);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"Available options are:",0x16);
            std::ios::widen((char)(ostringstream *)local_1a8 +
                            (char)*(undefined8 *)(local_1a8._0_8_ + -0x18));
            std::ostream::put((char)local_1a8);
            poVar8 = (ostream *)std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"  ",2);
            if (__s == (char *)0x0) {
              std::ios::clear((int)poVar8 + (int)poVar8->_vptr_basic_ostream[-3]);
            }
            else {
              sVar9 = strlen(__s);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,__s,sVar9);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," -M Continuous",0xe);
            std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
            std::ostream::put((char)poVar8);
            poVar8 = (ostream *)std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"  ",2);
            if (__s == (char *)0x0) {
              std::ios::clear((int)poVar8 + (int)poVar8->_vptr_basic_ostream[-3]);
            }
            else {
              sVar9 = strlen(__s);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,__s,sVar9);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," -M Experimental",0x10);
            std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
            std::ostream::put((char)poVar8);
            poVar8 = (ostream *)std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"  ",2);
            if (__s == (char *)0x0) {
              std::ios::clear((int)poVar8 + (int)poVar8->_vptr_basic_ostream[-3]);
            }
            else {
              sVar9 = strlen(__s);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,__s,sVar9);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," -M Nightly",0xb);
            std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
            std::__cxx11::stringbuf::str();
            Log(this,7,
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
                ,0xb2b,(char *)local_1d0,false);
            if (local_1d0 != local_1c0) {
              operator_delete(local_1d0,local_1c0[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base(local_138);
            bVar10 = false;
          }
        }
      }
    }
  }
  return bVar10;
}

Assistant:

bool cmCTest::HandleTestModelArgument(const char* ctestExec, size_t& i,
                                      const std::vector<std::string>& args)
{
  bool success = true;
  std::string const& arg = args[i];
  if (this->CheckArgument(arg, "-M"_s, "--test-model") &&
      (i < args.size() - 1)) {
    i++;
    std::string const& str = args[i];
    if (cmSystemTools::LowerCase(str) == "nightly"_s) {
      this->SetTestModel(cmCTest::NIGHTLY);
    } else if (cmSystemTools::LowerCase(str) == "continuous"_s) {
      this->SetTestModel(cmCTest::CONTINUOUS);
    } else if (cmSystemTools::LowerCase(str) == "experimental"_s) {
      this->SetTestModel(cmCTest::EXPERIMENTAL);
    } else {
      success = false;
      cmCTestLog(this, ERROR_MESSAGE,
                 "CTest -M called with incorrect option: " << str
                                                           << std::endl);
      cmCTestLog(this, ERROR_MESSAGE,
                 "Available options are:"
                   << std::endl
                   << "  " << ctestExec << " -M Continuous" << std::endl
                   << "  " << ctestExec << " -M Experimental" << std::endl
                   << "  " << ctestExec << " -M Nightly" << std::endl);
    }
  }
  return success;
}